

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O3

void __thiscall
Storage::Disk::IPF::add_unencoded_data
          (IPF *this,
          vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> *track,
          Time bit_length,size_t num_bits)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  long *plVar1;
  uint8_t uVar2;
  long *in_RAX;
  reference pvVar3;
  pointer *__ptr;
  ulong uVar4;
  long *local_38;
  
  local_38 = in_RAX;
  pvVar3 = std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::
           emplace_back<>(track);
  pvVar3->length_of_a_bit = bit_length;
  this_00 = &pvVar3->data;
  std::vector<bool,_std::allocator<bool>_>::reserve(this_00,num_bits << 4);
  Encodings::MFM::GetMFMEncoder((MFM *)&local_38,this_00,(vector<bool,_std::allocator<bool>_> *)0x0)
  ;
  if (num_bits != 0) {
    uVar4 = 0;
    do {
      plVar1 = local_38;
      uVar2 = FileHolder::get8(&this->file_);
      (**(code **)(*plVar1 + 0x18))(plVar1,uVar2,0);
      uVar4 = uVar4 + 8;
    } while (uVar4 < num_bits);
  }
  if ((ulong)(pvVar3->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
      ((long)(pvVar3->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
      (long)(pvVar3->data).super__Bvector_base<std::allocator<bool>_>._M_impl.
            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8 <=
      (num_bits * 2 + 0xe & 0xfffffffffffffff0)) {
    std::vector<bool,_std::allocator<bool>_>::resize(this_00,num_bits * 2,false);
    if (local_38 != (long *)0x0) {
      (**(code **)(*local_38 + 8))();
    }
    return;
  }
  __assert_fail("segment.data.size() <= (byte_length * 16)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/IPF.cpp"
                ,0x19e,
                "void Storage::Disk::IPF::add_unencoded_data(std::vector<Storage::Disk::PCMSegment> &, Time, size_t)"
               );
}

Assistant:

void IPF::add_unencoded_data(std::vector<Storage::Disk::PCMSegment> &track, Time bit_length, size_t num_bits) {
	auto &segment = track.emplace_back();
	segment.length_of_a_bit = bit_length;

	// Length appears to be in pre-encoded bits; double that to get encoded bits.
#ifndef NDEBUG
	const auto byte_length = (num_bits + 7) >> 3;
#endif
	segment.data.reserve(num_bits * 16);

	auto encoder = Storage::Encodings::MFM::GetMFMEncoder(segment.data);
	for(size_t c = 0; c < num_bits; c += 8) {
		encoder->add_byte(file_.get8());
	}

	assert(segment.data.size() <= (byte_length * 16));
	segment.data.resize(num_bits * 2);
}